

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O1

ON_Plane * __thiscall
ON_SubDVertex::VertexFrame
          (ON_Plane *__return_storage_ptr__,ON_SubDVertex *this,
          ON_SubDComponentLocation subd_appearance)

{
  ON_3dVector *v;
  double d;
  uint uVar1;
  ON_SubDFace *sector_face;
  ON_SubDEdge *this_00;
  ON_SubDVertex *this_01;
  ON_SubDFace *pOVar2;
  long lVar3;
  ON_Plane *pOVar4;
  ON_Plane *pOVar5;
  bool bVar6;
  byte bVar7;
  ON_3dVector X;
  ON_Plane vertex_frame;
  ON_3dVector V;
  ON_3dPoint local_188;
  ON_3dVector local_170;
  ON_3dPoint local_158;
  ON_Plane *local_140;
  ON_Plane local_138;
  ON_SubDSectorSurfacePoint local_b8;
  ON_3dPoint local_48;
  
  bVar7 = 0;
  uVar1 = FaceCount(this);
  if ((uVar1 == 0) || (sector_face = Face(this,0), sector_face == (ON_SubDFace *)0x0)) {
    pOVar5 = &ON_Plane::NanPlane;
    pOVar4 = __return_storage_ptr__;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pOVar4->origin).x = (pOVar5->origin).x;
      pOVar5 = (ON_Plane *)((long)pOVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar7 * -0x10 + 8);
    }
    return __return_storage_ptr__;
  }
  pOVar5 = &ON_Plane::NanPlane;
  pOVar4 = &local_138;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar4->origin).x = (pOVar5->origin).x;
    pOVar5 = (ON_Plane *)((long)pOVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  if (subd_appearance == ControlNet) {
    local_b8.m_limitP[2] = ON_3dVector::ZeroVector.z;
    local_b8.m_limitP[0] = ON_3dVector::ZeroVector.x;
    local_b8.m_limitP[1] = ON_3dVector::ZeroVector.y;
    local_140 = __return_storage_ptr__;
    if (this->m_edge_count != 0) {
      uVar1 = 0;
      do {
        this_00 = Edge(this,uVar1);
        bVar6 = true;
        if ((this_00 != (ON_SubDEdge *)0x0) &&
           (this_01 = ON_SubDEdge::OtherEndVertex(this_00,this), this_01 != (ON_SubDVertex *)0x0)) {
          if (this_00->m_face_count == 1) {
            pOVar2 = ON_SubDEdge::Face(this_00,0);
          }
          else {
            pOVar2 = (ON_SubDFace *)0x0;
          }
          bVar6 = pOVar2 == (ON_SubDFace *)0x0;
          if (!bVar6) {
            ControlNetPoint(&local_158,this_01);
            ControlNetPoint(&local_48,this);
            ON_3dPoint::operator-((ON_3dVector *)&local_188,&local_158,&local_48);
            ON_3dVector::UnitVector(&local_170,(ON_3dVector *)&local_188);
            local_b8.m_limitP[2] = local_170.z;
            local_b8.m_limitP[0] = local_170.x;
            local_b8.m_limitP[1] = local_170.y;
            bVar6 = false;
            sector_face = pOVar2;
          }
        }
      } while ((bVar6) && (uVar1 = uVar1 + 1, uVar1 < this->m_edge_count));
    }
    ControlNetPoint((ON_3dPoint *)&local_170,this);
    ON_SubDFace::ControlNetCenterNormal((ON_3dVector *)&local_188,sector_face);
    __return_storage_ptr__ = local_140;
    ON_Plane::CreateFromNormal(&local_138,(ON_3dPoint *)&local_170,(ON_3dVector *)&local_188);
    v = &local_138.zaxis;
    d = ON_3dVector::operator*((ON_3dVector *)&local_b8,v);
    ::operator*((ON_3dVector *)&local_158,d,v);
    ON_3dVector::operator-
              ((ON_3dVector *)&local_188,(ON_3dVector *)&local_b8,(ON_3dVector *)&local_158);
    ON_3dVector::UnitVector(&local_170,(ON_3dVector *)&local_188);
    bVar6 = ON_3dVector::IsUnitVector(&local_170);
    if (bVar6) {
      local_138.xaxis.z = local_170.z;
      local_138.xaxis.x = local_170.x;
      local_138.xaxis.y = local_170.y;
      ON_CrossProduct((ON_3dVector *)&local_158,v,&local_138.xaxis);
      ON_3dVector::UnitVector((ON_3dVector *)&local_188,(ON_3dVector *)&local_158);
      local_138.yaxis.z = local_188.z;
      local_138.yaxis.x = local_188.x;
      local_138.yaxis.y = local_188.y;
    }
  }
  else {
    uVar1 = FaceCount(this);
    if ((uVar1 != 0) && (bVar6 = GetSurfacePoint(this,sector_face,false,&local_b8), !bVar6)) {
      pOVar5 = &ON_Plane::NanPlane;
      lVar3 = 0x10;
      pOVar4 = __return_storage_ptr__;
      goto LAB_0060d04e;
    }
    ON_CrossProduct(&local_170,local_b8.m_limitN,local_b8.m_limitT1);
    ON_3dVector::Unitize(&local_170);
    ON_3dPoint::ON_3dPoint(&local_188,local_b8.m_limitP);
    ON_3dVector::ON_3dVector((ON_3dVector *)&local_158,local_b8.m_limitN);
    ON_Plane::CreateFromNormal(&local_138,&local_188,(ON_3dVector *)&local_158);
    local_138.yaxis.x = local_170.x;
    local_138.yaxis.y = local_170.y;
    local_138.yaxis.z = local_170.z;
    ON_CrossProduct((ON_3dVector *)&local_188,&local_138.yaxis,&local_138.zaxis);
    local_138.xaxis.z = local_188.z;
    local_138.xaxis.x = local_188.x;
    local_138.xaxis.y = local_188.y;
    ON_3dVector::Unitize(&local_138.xaxis);
  }
  pOVar5 = &local_138;
  bVar6 = ON_Plane::IsValid(pOVar5);
  if (!bVar6) {
    pOVar5 = &ON_Plane::NanPlane;
  }
  lVar3 = 0x10;
  pOVar4 = __return_storage_ptr__;
LAB_0060d04e:
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar4->origin).x = (pOVar5->origin).x;
    pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar7 * -0x10 + 8);
    pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar7 * -0x10 + 8);
  }
  ON_Plane::~ON_Plane(&local_138);
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDVertex::VertexFrame(
  ON_SubDComponentLocation subd_appearance
) const
{
  if (0 == FaceCount())
    return ON_Plane::NanPlane;

  const ON_SubDFace* sector_face = Face(0);
  if (nullptr == sector_face)
    return ON_Plane::NanPlane;

  ON_Plane vertex_frame(ON_Plane::NanPlane);
  if (ON_SubDComponentLocation::ControlNet == subd_appearance)
  {
    ON_3dVector V = ON_3dVector::ZeroVector;
    for (int vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = Edge(vei);
      if (nullptr == e)
        continue;
      const ON_SubDVertex* v1 = e->OtherEndVertex(this);
      if (nullptr == v1)
        continue;
      const ON_SubDFace* f = (1 == e->m_face_count) ? e->Face(0) : nullptr;
      if (nullptr == f)
        continue;
      sector_face = f;
      V = (v1->ControlNetPoint() - ControlNetPoint()).UnitVector();
      break;
    }
    vertex_frame.CreateFromNormal(ControlNetPoint(), sector_face->ControlNetCenterNormal());
    const ON_3dVector X = (V - (V * vertex_frame.zaxis) * vertex_frame.zaxis).UnitVector();
    if (X.IsUnitVector())
    {
      vertex_frame.xaxis = X;
      vertex_frame.yaxis = ON_CrossProduct(vertex_frame.zaxis, vertex_frame.xaxis).UnitVector();
    }
  }
  else
  {
    // If this is a smooth vertex or a crease vertex on the boundary,
    // then the sector_face does not matter. Otherwise it picks the
    // "side of the crease" for the normal.
    ON_SubDSectorSurfacePoint limit_point;
    if (FaceCount())
      if (false == GetSurfacePoint(sector_face, limit_point))
        return ON_Plane::NanPlane;

    ON_3dVector Y(ON_CrossProduct(limit_point.m_limitN, limit_point.m_limitT1));
    Y.Unitize();

    // The normal is more important than the tangent direction. 
    vertex_frame.CreateFromNormal(ON_3dPoint(limit_point.m_limitP), ON_3dVector(limit_point.m_limitN));
    vertex_frame.yaxis = Y;
    vertex_frame.xaxis = ON_CrossProduct(vertex_frame.yaxis, vertex_frame.zaxis);
    vertex_frame.xaxis.Unitize();
  }

  return vertex_frame.IsValid() ? vertex_frame : ON_Plane::NanPlane;
}